

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme-test.cc
# Opt level: O3

void scope_example2::Execute(void)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  thread worker;
  MyLogger capture_messages;
  thread local_a0;
  Logger local_98;
  _Any_data local_28;
  code *local_18;
  
  f();
  if ((code *)local_98.lock_.super___mutex_base._M_mutex._8_8_ == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  else {
    (*(code *)local_98.lock_.super___mutex_base._M_mutex._16_8_)();
    if ((code *)local_98.lock_.super___mutex_base._M_mutex._8_8_ != (code *)0x0) {
      (*(code *)local_98.lock_.super___mutex_base._M_mutex._8_8_)(&local_98,&local_98,3);
    }
    g();
    if ((code *)local_98.lock_.super___mutex_base._M_mutex._8_8_ != (code *)0x0) {
      (*(code *)local_98.lock_.super___mutex_base._M_mutex._16_8_)();
      if ((code *)local_98.lock_.super___mutex_base._M_mutex._8_8_ != (code *)0x0) {
        (*(code *)local_98.lock_.super___mutex_base._M_mutex._8_8_)(&local_98,&local_98,3);
      }
      h();
      if ((code *)local_98.lock_.super___mutex_base._M_mutex._8_8_ != (code *)0x0) {
        (*(code *)local_98.lock_.super___mutex_base._M_mutex._16_8_)();
        if ((code *)local_98.lock_.super___mutex_base._M_mutex._8_8_ != (code *)0x0) {
          (*(code *)local_98.lock_.super___mutex_base._M_mutex._8_8_)(&local_98,&local_98,3);
        }
        Logger::Logger(&local_98);
        g();
        std::thread::thread<std::function<void()>,,void>(&local_a0,(function<void_()> *)&local_28);
        if (local_18 != (code *)0x0) {
          (*local_18)(&local_28,&local_28,__destroy_functor);
        }
        std::thread::join();
        if (local_a0._M_id._M_thread == 0) {
          local_98.super_ThreadCapture<Logger>._vptr_ThreadCapture =
               (_func_int **)&PTR__Logger_00107c88;
          local_98.cross_and_capture_to_.super_ThreadCrosser._vptr_ThreadCrosser =
               (_func_int **)&PTR__AutoThreadCrosser_00107cd0;
          *(Logger **)(in_FS_OFFSET + -0x10) = local_98.cross_and_capture_to_.capture_to_.previous_;
          capture_thread::ThreadCrosser::SetCurrent
                    (local_98.cross_and_capture_to_.cross_with_.parent_);
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&local_98.lines_.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          return;
        }
        std::terminate();
      }
      goto LAB_00103a1e;
    }
  }
  std::__throw_bad_function_call();
LAB_00103a1e:
  uVar1 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar1);
}

Assistant:

void Execute() {
  f()();  // Fine.
  g()();  // Fine.
  h()();  // SIGSEGV!

  // Fine. g captures capture_messages, but capture_messages doesn't go out of
  // scope until the worker thread is joined.
  MyLogger capture_messages;
  std::thread worker(g());
  worker.join();
}